

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O0

void __thiscall WriteIncludesBase::acceptLayout(WriteIncludesBase *this,DomLayout *node)

{
  long lVar1;
  long in_RDI;
  long in_FS_OFFSET;
  DomCustomWidget *in_stack_00000050;
  QString *in_stack_00000058;
  WriteIncludesBase *in_stack_00000060;
  DomLayout *in_stack_ffffffffffffffb8;
  DomLayout *in_stack_ffffffffffffffe0;
  TreeWalker *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  DomLayout::attributeClass(in_stack_ffffffffffffffb8);
  add(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  QString::~QString((QString *)0x197aab);
  *(undefined1 *)(in_RDI + 0x18) = 1;
  TreeWalker::acceptLayout(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::acceptLayout(DomLayout *node)
{
    add(node->attributeClass());
    m_laidOut = true;
    TreeWalker::acceptLayout(node);
}